

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O1

bool __thiscall Letter::operator<(Letter *this,Letter *other)

{
  size_t sVar1;
  int iVar2;
  byte extraout_var;
  byte extraout_var_00;
  byte extraout_var_01;
  byte extraout_var_02;
  byte bVar3;
  
  if (this->zip == other->zip) {
    sVar1 = (this->address)._M_string_length;
    if ((sVar1 == (other->address)._M_string_length) &&
       ((sVar1 == 0 ||
        (iVar2 = bcmp((this->address)._M_dataplus._M_p,(other->address)._M_dataplus._M_p,sVar1),
        iVar2 == 0)))) {
      sVar1 = (this->district)._M_string_length;
      if ((sVar1 == (other->district)._M_string_length) &&
         ((sVar1 == 0 ||
          (iVar2 = bcmp((this->district)._M_dataplus._M_p,(other->district)._M_dataplus._M_p,sVar1),
          iVar2 == 0)))) {
        sVar1 = (this->province)._M_string_length;
        if ((sVar1 == (other->province)._M_string_length) &&
           ((sVar1 == 0 ||
            (iVar2 = bcmp((this->province)._M_dataplus._M_p,(other->province)._M_dataplus._M_p,sVar1
                         ), iVar2 == 0)))) {
          std::__cxx11::string::compare((string *)this);
          bVar3 = extraout_var_02;
        }
        else {
          std::__cxx11::string::compare((string *)&this->province);
          bVar3 = extraout_var_01;
        }
      }
      else {
        std::__cxx11::string::compare((string *)&this->district);
        bVar3 = extraout_var_00;
      }
    }
    else {
      std::__cxx11::string::compare((string *)&this->address);
      bVar3 = extraout_var;
    }
    return (bool)(bVar3 >> 7);
  }
  return this->zip < other->zip;
}

Assistant:

bool operator<(const Letter &other) const {
        //**Begin Insert**
        if (this->zip != other.zip)  {
            return this->zip < other.zip;
        }
        else if (this->address != other.address) {
            return this->address < other.address;
        }
        else if (this->district != other.district) {
            return this->district < other.district;
        }
        else if (this->province != other.province) {
            return this->province < other.province;
        }
        else {
            return this->name < other.name;
        }
        //**End Insert**
    }